

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

long __thiscall Arcflow::go(Arcflow *this)

{
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *this_00;
  int it;
  pointer piVar1;
  int *piVar2;
  pointer pIVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  iterator iVar8;
  int *piVar9;
  uint *puVar10;
  runtime_error *this_01;
  int iVar11;
  int iVar12;
  vector<int,_std::allocator<int>_> *in_RSI;
  ulong uVar13;
  long lVar14;
  int iVar15;
  pointer pvVar16;
  int iVar17;
  vector<int,_std::allocator<int>_> valid_opts;
  vector<int,_std::allocator<int>_> sv;
  vector<int,_std::allocator<int>_> key;
  vector<int,_std::allocator<int>_> maxw;
  char _error_msg_ [256];
  int local_1fc;
  vector<int,_std::allocator<int>_> local_1f8;
  vector<int,_std::allocator<int>_> local_1d8;
  vector<int,_std::allocator<int>_> local_1c0;
  vector<int,_std::allocator<int>_> local_1a8;
  vector<int,_std::allocator<int>_> local_190;
  vector<int,_std::allocator<int>_> local_178;
  vector<int,_std::allocator<int>_> local_160;
  Arc local_144;
  vector<int,_std::allocator<int>_> local_138 [11];
  
  lVar6 = (long)(this->inst).ndims;
  piVar1 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar17 = 0;
  if ((this->inst).binary == false) {
    iVar17 = piVar1[lVar6 + 1];
  }
  it = piVar1[lVar6];
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1f8,&this->max_label);
  local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_190,(long)(this->inst).ndims,(value_type_conflict *)local_138,
             (allocator_type *)&local_1a8);
  local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_ << 0x20);
  if (0 < (this->inst).nbtypes) {
    uVar7 = (ulong)(uint)(this->inst).ndims;
    iVar11 = 0;
    do {
      if ((int)uVar7 < 1) {
LAB_0010ba16:
        if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_1d8,
                     (iterator)
                     local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_138);
        }
        else {
          *local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar11;
          local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar5 = (this->inst).ndims;
        uVar7 = (ulong)uVar5;
        if (0 < (int)uVar5) {
          pvVar16 = (this->inst).Ws.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = 0;
          do {
            iVar11 = *(int *)(*(long *)&pvVar16[(int)local_138[0].
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data + lVar6 * 4);
            iVar15 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6];
            if (iVar11 < local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6]) {
              iVar15 = iVar11;
            }
            local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6] = iVar15;
            iVar11 = *(int *)(*(long *)&pvVar16[(int)local_138[0].
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data + lVar6 * 4);
            if (iVar11 < local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar6]) {
              iVar11 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar6];
            }
            local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6] = iVar11;
            lVar6 = lVar6 + 1;
            uVar7 = (ulong)(this->inst).ndims;
          } while (lVar6 < (long)uVar7);
        }
      }
      else {
        piVar9 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (this->inst).Ws.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar11].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if (*piVar9 <= *piVar2) {
          uVar4 = 1;
          do {
            uVar13 = uVar4;
            if ((uVar7 & 0xffffffff) == uVar13) break;
            uVar4 = uVar13 + 1;
          } while (piVar9[uVar13] <= piVar2[uVar13]);
          if ((uVar7 & 0xffffffff) <= uVar13) goto LAB_0010ba16;
        }
      }
      iVar11 = (int)local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
      local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_138[0].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar11);
    } while (iVar11 < (this->inst).nbtypes);
  }
  if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar5 = 0xffffffff;
    goto LAB_0010bf3c;
  }
  uVar7 = (ulong)(this->inst).ndims;
  if ((long)uVar7 < 1) {
LAB_0010bb6c:
    uVar5 = NodeSet::get_index(&this->NS,&local_1f8);
  }
  else {
    piVar9 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if (*piVar9 ==
        *local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
      uVar4 = 1;
      do {
        uVar13 = uVar4;
        if (uVar7 == uVar13) break;
        uVar4 = uVar13 + 1;
      } while (piVar9[uVar13] ==
               local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13]);
      if (uVar7 <= uVar13) goto LAB_0010bb6c;
    }
    lift_state(this,&local_1d8,in_RSI,it,iVar17);
    hash(&local_1a8,this,in_RSI);
    this_00 = &this->dp;
    iVar8 = std::
            _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
            ::find(&this_00->_M_t,&local_1a8);
    if ((_Rb_tree_header *)iVar8._M_node == &(this->dp)._M_t._M_impl.super__Rb_tree_header) {
      iVar11 = it + 1;
      iVar15 = (this->inst).nsizes;
      local_1fc = -1;
      if (iVar11 < iVar15) {
        std::vector<int,_std::allocator<int>_>::vector(&local_1c0,in_RSI);
        local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(this->inst).ndims] = iVar11;
        if ((this->inst).binary == false) {
          local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)(this->inst).ndims + 1] = 0;
        }
        std::vector<int,_std::allocator<int>_>::vector(&local_160,&local_1c0);
        lVar6 = go(this);
        if (local_160.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_160.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_1fc = (int)lVar6;
        if (local_1fc == -1) {
          snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d"
                   ,"up != -1",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                   ,0x138);
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,(char *)local_138);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        NodeSet::get_label(local_138,&this->NS,local_1fc);
        piVar1 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1);
          if (local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        if (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar15 = (this->inst).nsizes;
      }
      if ((it < iVar15) &&
         (iVar17 < (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[it])) {
        std::vector<int,_std::allocator<int>_>::vector(local_138,in_RSI);
        pvVar16 = (this->weights).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + it;
        pIVar3 = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = pIVar3[it].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = *(pointer *)
                  ((long)&pIVar3[it].nonzero.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                  8);
        if (piVar9 != piVar2) {
          lVar6 = *(long *)&(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data;
          do {
            lVar14 = (long)*piVar9;
            iVar15 = local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14] + *(int *)(lVar6 + lVar14 * 4);
            local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14] = iVar15;
            if (local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar14] < iVar15) {
              uVar5 = NodeSet::get_index(&this->NS,&local_1f8);
              puVar10 = (uint *)std::
                                map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                                ::operator[](this_00,&local_1a8);
              *puVar10 = uVar5;
              if (local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              goto LAB_0010bf2d;
            }
            piVar9 = piVar9 + 1;
          } while (piVar9 != piVar2);
        }
        if ((this->inst).binary == true) {
          local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(this->inst).ndims] = iVar11;
        }
        else {
          iVar15 = (this->inst).ndims;
          if (iVar17 + 1 <
              (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[it]) {
            local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar15] = it;
            local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)(this->inst).ndims + 1] = iVar17 + 1;
          }
          else {
            local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar15] = iVar11;
            local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)(this->inst).ndims + 1] = 0;
          }
        }
        std::vector<int,_std::allocator<int>_>::vector(&local_178,local_138);
        lVar6 = go(this);
        if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar17 = (int)lVar6;
        if (iVar17 != -1) {
          NodeSet::get_label(&local_1c0,&this->NS,iVar17);
          iVar15 = (this->inst).ndims;
          if (0 < iVar15) {
            lVar6 = *(long *)&(pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data;
            lVar14 = 0;
            do {
              iVar15 = local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14] - *(int *)(lVar6 + lVar14 * 4);
              if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar14] <= iVar15) {
                iVar15 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar14];
              }
              local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14] = iVar15;
              lVar14 = lVar14 + 1;
              iVar15 = (this->inst).ndims;
            } while (lVar14 < iVar15);
          }
          if ((this->inst).binary != false) {
            iVar12 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar15];
            if (iVar11 < local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar15]) {
              iVar12 = iVar11;
            }
            local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar15] = iVar12;
          }
          iVar11 = NodeSet::get_index(&this->NS,&local_1f8);
          local_144.u = iVar11;
          local_144.v = iVar17;
          local_144.label = it;
          std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::
          _M_insert_unique<Arc>(&(this->AS)._M_t,&local_144);
          if (iVar11 != local_1fc && local_1fc != -1) {
            local_144.label = this->LOSS;
            local_144.v = local_1fc;
            local_144.u = iVar11;
            std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::
            _M_insert_unique<Arc>(&(this->AS)._M_t,&local_144);
          }
          if (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        if (local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      uVar5 = NodeSet::get_index(&this->NS,&local_1f8);
      puVar10 = (uint *)std::
                        map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[](this_00,&local_1a8);
      *puVar10 = uVar5;
    }
    else {
      uVar5 = *(uint *)&iVar8._M_node[1]._M_right;
    }
LAB_0010bf2d:
    if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
LAB_0010bf3c:
  if (local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (ulong)uVar5;
}

Assistant:

int Arcflow::go(std::vector<int> su) {
	int it = su[inst.ndims];
	int ic = inst.binary ? 0 : su[inst.ndims + 1];
	std::vector<int> valid_opts;
	std::vector<int> mu(max_label);
	std::vector<int> maxw(inst.ndims, 0);
	for (int t = 0; t < inst.nbtypes; t++) {
		if (is_valid(su, inst.Ws[t])) {
			valid_opts.push_back(t);
			for (int d = 0; d < inst.ndims; d++) {
				mu[d] = std::min(mu[d], inst.Ws[t][d]);
				maxw[d] = std::max(maxw[d], inst.Ws[t][d]);
			}
		}
	}
	if (valid_opts.empty()) {  // if invalid
		return -1;
	} else if (is_full(su, maxw)) {  // if full
		return NS.get_index(mu);
	} else {
		lift_state(valid_opts, su, it, ic);
	}

	// const vector<int> key(su);
	const std::vector<int> key(hash(su));
	std::map<std::vector<int>, int>::iterator itr = dp.find(key);
	if (itr != dp.end()) {
		return itr->second;
	}

	int up = -1;
	if (it + 1 < inst.nsizes) {
		std::vector<int> sv(su);
		sv[inst.ndims] = it + 1;
		if (!inst.binary) {
			sv[inst.ndims + 1] = 0;
		}
		up = go(sv);
		throw_assert(up != -1);
		mu = NS.get_label(up);
	}

	if (it < inst.nsizes && ic < max_rep[it]) {
		std::vector<int> sv(su);
		const std::vector<int> &w = weights[it];
		for (int d : sitems[it].nonzero) {
			sv[d] += w[d];
			if (sv[d] > maxw[d]) {  // if invalid
				return dp[key] = NS.get_index(mu);
			}
		}

		if (inst.binary) {
			sv[inst.ndims] = it + 1;
		} else {
			if (ic + 1 < max_rep[it]) {
				sv[inst.ndims] = it;
				sv[inst.ndims + 1] = ic + 1;
			} else {
				sv[inst.ndims] = it + 1;
				sv[inst.ndims + 1] = 0;
			}
		}

		int iv = go(sv);

		if (iv != -1) {
			const std::vector<int> &v = NS.get_label(iv);
			for (int d = 0; d < inst.ndims; d++) {
				mu[d] = std::min(mu[d], v[d] - w[d]);
			}
			if (inst.binary) {
				mu[inst.ndims] = std::min(mu[inst.ndims], it + 1);
			}
			int iu = NS.get_index(mu);
			AS.insert(Arc(iu, iv, it));
			if (up != -1 && iu != up) {
				AS.insert(Arc(iu, up, LOSS));
			}
		}
	}

	return dp[key] = NS.get_index(mu);
}